

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int resolveOrderByTermToExprList(Parse *pParse,Select *pSelect,Expr *pE)

{
  u8 uVar1;
  int iVar2;
  sqlite3 *psVar3;
  int iVar4;
  uint uVar5;
  Expr *in_RCX;
  ExprList **ppEVar6;
  long lVar7;
  NameContext local_60;
  
  local_60.pWinSelect = (Select *)0x0;
  local_60.pNext = (NameContext *)0x0;
  local_60.nRef = 0;
  local_60.nNcErr = 0;
  local_60.ncFlags = 0x80081;
  local_60._44_4_ = 0;
  psVar3 = pParse->db;
  uVar1 = psVar3->suppressErr;
  psVar3->suppressErr = '\x01';
  local_60.pParse = pParse;
  local_60.pSrcList = (SrcList *)pE;
  local_60.uNC = (anon_union_8_4_82a96254_for_uNC)pSelect;
  iVar4 = sqlite3ResolveExprNames(&local_60,in_RCX);
  psVar3->suppressErr = uVar1;
  if ((iVar4 == 0) &&
     (iVar4._0_1_ = pSelect->op, iVar4._1_1_ = pSelect->field_0x1, iVar4._2_2_ = pSelect->nSelectRow
     , 0 < iVar4)) {
    ppEVar6 = (ExprList **)&pSelect->iLimit;
    lVar7 = 0;
    do {
      uVar5 = sqlite3ExprCompare((Parse *)0x0,(Expr *)*ppEVar6,in_RCX,-1);
      if (uVar5 < 2) {
        return (int)lVar7 + 1;
      }
      lVar7 = lVar7 + 1;
      iVar2._0_1_ = pSelect->op;
      iVar2._1_1_ = pSelect->field_0x1;
      iVar2._2_2_ = pSelect->nSelectRow;
      ppEVar6 = ppEVar6 + 3;
    } while (lVar7 < iVar2);
  }
  return 0;
}

Assistant:

static int resolveOrderByTermToExprList(
  Parse *pParse,     /* Parsing context for error messages */
  Select *pSelect,   /* The SELECT statement with the ORDER BY clause */
  Expr *pE           /* The specific ORDER BY term */
){
  int i;             /* Loop counter */
  ExprList *pEList;  /* The columns of the result set */
  NameContext nc;    /* Name context for resolving pE */
  sqlite3 *db;       /* Database connection */
  int rc;            /* Return code from subprocedures */
  u8 savedSuppErr;   /* Saved value of db->suppressErr */

  assert( sqlite3ExprIsInteger(pE, &i)==0 );
  pEList = pSelect->pEList;

  /* Resolve all names in the ORDER BY term expression
  */
  memset(&nc, 0, sizeof(nc));
  nc.pParse = pParse;
  nc.pSrcList = pSelect->pSrc;
  nc.uNC.pEList = pEList;
  nc.ncFlags = NC_AllowAgg|NC_UEList|NC_NoSelect;
  nc.nNcErr = 0;
  db = pParse->db;
  savedSuppErr = db->suppressErr;
  db->suppressErr = 1;
  rc = sqlite3ResolveExprNames(&nc, pE);
  db->suppressErr = savedSuppErr;
  if( rc ) return 0;

  /* Try to match the ORDER BY expression against an expression
  ** in the result set.  Return an 1-based index of the matching
  ** result-set entry.
  */
  for(i=0; i<pEList->nExpr; i++){
    if( sqlite3ExprCompare(0, pEList->a[i].pExpr, pE, -1)<2 ){
      return i+1;
    }
  }

  /* If no match, return 0. */
  return 0;
}